

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_214010::CAPIExternalCommand::processMakefileDiscoveredDependencies
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          string *depsPath,bool ignoreSubsequentOutputs)

{
  char *S;
  bool bVar1;
  FileSystem *pFVar2;
  BuildSystemDelegate *pBVar3;
  Child CVar4;
  Child local_10a8;
  long local_10a0;
  SmallString<4096U> *local_1098;
  undefined1 local_1090;
  Child local_1088 [3];
  Child local_1070;
  ulong local_1068;
  Twine local_1058;
  SmallString<4096U> absPath;
  
  llvm::Twine::Twine((Twine *)&absPath,(string *)context);
  bVar1 = llvm::sys::path::is_absolute((Twine *)&absPath,native);
  if (bVar1) {
    pFVar2 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    (*pFVar2->_vptr_FileSystem[4])(&absPath,pFVar2,context);
    CVar4 = (Child)absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  }
  else {
    S = (this->workingDirectory)._M_dataplus._M_p;
    llvm::SmallVector<char,4096u>::SmallVector<char_const*,void>
              (&absPath.super_SmallVector<char,_4096U>,S,
               S + (this->workingDirectory)._M_string_length);
    llvm::Twine::Twine((Twine *)&local_10a8,(string *)context);
    llvm::Twine::Twine((Twine *)&local_1070,"");
    llvm::Twine::Twine((Twine *)local_1088,"");
    llvm::Twine::Twine(&local_1058,"");
    llvm::sys::path::append
              ((SmallVectorImpl<char> *)&absPath,(Twine *)&local_10a8,(Twine *)&local_1070,
               (Twine *)local_1088,&local_1058);
    llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)&absPath);
    pFVar2 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    local_1068 = absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                 0xffffffff;
    local_1070.twine =
         (Twine *)absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                  super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    llvm::StringRef::str_abi_cxx11_((string *)&local_10a8,(StringRef *)&local_1070);
    (*pFVar2->_vptr_FileSystem[4])(local_1088,pFVar2,&local_10a8);
    CVar4 = local_1088[0];
    local_1088[0].twine = (Twine *)0x0;
    std::__cxx11::string::_M_dispose();
    llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&absPath);
  }
  if (CVar4.twine == (Twine *)0x0) {
    pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate(system);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10a8,
                   "unable to open dependencies file (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&absPath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10a8,
                   ")");
    (*pBVar3->_vptr_BuildSystemDelegate[0xb])
              (pBVar3,this,
               absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX,
               absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase._8_8_);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    bVar1 = false;
  }
  else {
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts._24_8_ =
         context->_vptr_QueueJobContext;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts._32_8_ =
         context[1]._vptr_QueueJobContext;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = &PTR__ParseActions_0022c238;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0x28].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0x29].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0x2a].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0x2b].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    local_10a8 = (Child)(CVar4.stdString)->_M_string_length;
    local_10a0 = *(long *)&(CVar4.twine)->LHSKind - (long)local_10a8;
    local_1090 = SUB81(depsPath,0);
    local_1098 = &absPath;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase._8_8_ = system;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts._0_8_ =
         ti.impl;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts._8_8_ =
         ti.ctx;
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts._16_8_ =
         this;
    llbuild::core::MakefileDepsParser::parse((MakefileDepsParser *)&local_10a8);
    bVar1 = absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts.
            _40_4_ == 0;
    llbuild::core::MakefileDepsParser::ParseActions::~ParseActions((ParseActions *)&absPath);
    (**(code **)(*CVar4.decUL + 8))(CVar4.twine);
  }
  return bVar1;
}

Assistant:

bool processMakefileDiscoveredDependencies(BuildSystem& system,
                                             core::TaskInterface ti,
                                             QueueJobContext* context,
                                             std::string depsPath,
                                             bool ignoreSubsequentOutputs) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }
    
    // Parse the output.
    //
    // We just ignore the rule, and add any dependency that we encounter in the
    // file.
    struct DepsActions : public core::MakefileDepsParser::ParseActions {
      BuildSystem& system;
      core::TaskInterface ti;
      CAPIExternalCommand* command;
      StringRef depsPath;
      unsigned numErrors{0};
      
      DepsActions(BuildSystem& system,
                  core::TaskInterface ti,
                  CAPIExternalCommand* command, StringRef depsPath)
      : system(system), ti(ti), command(command), depsPath(depsPath) {}
      
      virtual void error(StringRef message, uint64_t position) override {
        system.getDelegate().commandHadError(command, "error reading dependency file '" + depsPath.str() + "': " + std::string(message));
        ++numErrors;
      }
      
      virtual void actOnRuleDependency(StringRef dependency,
                                       StringRef unescapedWord) override {
        if (llvm::sys::path::is_absolute(unescapedWord)) {
          ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
          system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
          return;
        }

        // Generate absolute path
        //
        // NOTE: This is making the assumption that relative paths coming in a
        // dependency file are in relation to the explictly set working
        // directory, or the current working directory when it has not been set.
        SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
        llvm::sys::path::append(absPath, unescapedWord);
        llvm::sys::fs::make_absolute(absPath);

        ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
      }

      virtual void actOnRuleStart(StringRef name,
                                  const StringRef unescapedWord) override {}

      virtual void actOnRuleEnd() override {}
    };
    
    DepsActions actions(system, ti, this, depsPath);
    core::MakefileDepsParser(input->getBuffer(), actions, ignoreSubsequentOutputs).parse();
    return actions.numErrors == 0;
  }